

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O2

void __thiscall
hrgls::datablob::DataBlobSource::DataBlobSource
          (DataBlobSource *this,API *api,StreamProperties *props,string *source)

{
  hrgls_DataBlobSourceCreateParams phVar1;
  mapped_type mVar2;
  DataBlobSource_private *pDVar3;
  element_type *peVar4;
  mapped_type *pmVar5;
  _Rb_tree_header *p_Var6;
  hrgls_API phVar7;
  shared_ptr<hrgls_StreamProperties_> sVar8;
  hrgls_DataBlobSourceCreateParams params;
  StreamProperties local_58;
  string *local_48;
  StreamProperties *local_40;
  key_type local_38;
  
  this->m_private = (DataBlobSource_private *)0x0;
  local_48 = source;
  local_40 = props;
  pDVar3 = (DataBlobSource_private *)operator_new(0x70);
  p_Var6 = &(pDVar3->m_status)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(pDVar3->m_status)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (pDVar3->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pDVar3->m_stream = (hrgls_DataBlobSource)0x0;
  *(undefined8 *)&(pDVar3->m_status)._M_t._M_impl = 0;
  (pDVar3->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
  (pDVar3->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
  (pDVar3->m_status)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pDVar3->m_cppHandler = (StreamCallback)0x0;
  pDVar3->m_cppUserData = (void *)0x0;
  (pDVar3->m_cppMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pDVar3->m_cppMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pDVar3->m_cppMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (pDVar3->m_cppMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pDVar3->m_cppMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->m_private = pDVar3;
  mVar2 = hrgls_DataBlobSourceCreateParametersCreate(&params);
  pDVar3 = this->m_private;
  peVar4 = (element_type *)pthread_self();
  local_58.m_private.
  super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar4;
  pmVar5 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&pDVar3->m_status,(key_type *)&local_58);
  *pmVar5 = mVar2;
  local_58.m_private.
  super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar4;
  pmVar5 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&this->m_private->m_status,(key_type *)&local_58);
  if (*pmVar5 == 0) {
    if (api->m_private == (API_private *)0x0) {
      phVar7 = (hrgls_API)0x0;
    }
    else {
      phVar7 = api->m_private->m_api;
    }
    mVar2 = hrgls_DataBlobSourceCreateParametersSetAPI(params,phVar7);
    local_58.m_private.
    super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar4;
    pmVar5 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&this->m_private->m_status,(key_type *)&local_58);
    *pmVar5 = mVar2;
    local_58.m_private.
    super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar4;
    pmVar5 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&this->m_private->m_status,(key_type *)&local_58);
    phVar1 = params;
    if (*pmVar5 == 0) {
      sVar8 = StreamProperties::GetRawProperties(&local_58);
      mVar2 = hrgls_DataBlobSourceCreateParametersSetStreamProperties
                        (phVar1,local_58.m_private.
                                super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,
                         sVar8.
                         super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._M_pi);
      local_38._M_thread = (native_handle_type)peVar4;
      pmVar5 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&this->m_private->m_status,&local_38);
      *pmVar5 = mVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.m_private.
                  super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      local_58.m_private.
      super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar4;
      pmVar5 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&this->m_private->m_status,(key_type *)&local_58);
      if (*pmVar5 == 0) {
        mVar2 = hrgls_DataBlobSourceCreateParametersSetName(params,(local_48->_M_dataplus)._M_p);
        local_58.m_private.
        super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = peVar4;
        pmVar5 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&this->m_private->m_status,(key_type *)&local_58);
        *pmVar5 = mVar2;
        local_58.m_private.
        super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = peVar4;
        pmVar5 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&this->m_private->m_status,(key_type *)&local_58);
        if (*pmVar5 == 0) {
          mVar2 = hrgls_DataBlobSourceCreate(this->m_private,params);
          local_58.m_private.
          super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar4;
          pmVar5 = std::
                   map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                   ::operator[](&this->m_private->m_status,(key_type *)&local_58);
          *pmVar5 = mVar2;
          local_58.m_private.
          super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar4;
          std::
          map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
          ::operator[](&this->m_private->m_status,(key_type *)&local_58);
        }
      }
    }
    hrgls_DataBlobSourceCreateParametersDestroy(params);
  }
  return;
}

Assistant:

DataBlobSource::DataBlobSource(
      API &api,
      StreamProperties &props,
      ::std::string source)
    {
      // Create the private api pointer we're going to use.  Check for
      // exception when creating it, to avoid passing it up to the caller.
      try {
        m_private = new DataBlobSource_private();
      } catch (...) {
        m_private = nullptr;
        return;
      }

      // Create and fill in the parameters to the stream creation routine
      hrgls_DataBlobSourceCreateParams params;
      m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceCreateParametersCreate(&params);
      if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
        return;
      }
      m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceCreateParametersSetAPI(params, api.GetRawAPI());
      if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
        hrgls_DataBlobSourceCreateParametersDestroy(params);
        return;
      }
      m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceCreateParametersSetStreamProperties(params,
        props.GetRawProperties().get());
      if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
        hrgls_DataBlobSourceCreateParametersDestroy(params);
        return;
      }
      m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceCreateParametersSetName(params, source.c_str());
      if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
        hrgls_DataBlobSourceCreateParametersDestroy(params);
        return;
      }

      m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceCreate(&m_private->m_stream, params);
      if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
        hrgls_DataBlobSourceCreateParametersDestroy(params);
        return;
      }

      // Delete the structures we created along the way
      hrgls_DataBlobSourceCreateParametersDestroy(params);
    }